

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O2

long mkvparser::VideoTrack::Parse
               (Segment *pSegment,Info *info,longlong element_start,longlong element_size,
               VideoTrack **pResult)

{
  IMkvReader *pReader;
  longlong lVar1;
  longlong lVar2;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> uVar3;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> uVar4;
  unique_ptr<char[],_std::default_delete<char[]>_> uVar5;
  VideoTrack **ppVVar6;
  bool bVar7;
  int iVar8;
  long lVar9;
  longlong lVar10;
  VideoTrack *this;
  long stop;
  longlong pos;
  longlong size;
  char *colour_space;
  unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_> projection_ptr;
  unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_> colour_ptr;
  unique_ptr<char[],_std::default_delete<char[]>_> colour_space_ptr;
  longlong local_98;
  longlong local_90;
  longlong local_88;
  longlong local_80;
  longlong local_78;
  longlong local_70;
  double local_68;
  double rate;
  Segment *local_58;
  longlong local_50;
  longlong local_48;
  VideoTrack **local_40;
  longlong id;
  
  lVar9 = -1;
  if ((*pResult == (VideoTrack *)0x0) && (info->type == 1)) {
    rate = 0.0;
    colour_space_ptr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
    super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
    super__Head_base<0UL,_char_*,_false>._M_head_impl =
         (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
         (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
    pReader = pSegment->m_pReader;
    pos = (info->settings).start;
    stop = (info->settings).size + pos;
    colour_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t.
    super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
    super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::Colour,_std::default_delete<mkvparser::Colour>,_true,_true>)
         (__uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>)0x0;
    projection_ptr._M_t.
    super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>._M_t.
    super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>.
    super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl =
         (__uniq_ptr_data<mkvparser::Projection,_std::default_delete<mkvparser::Projection>,_true,_true>
          )(__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>)0x0;
    local_70 = 0;
    local_68 = 0.0;
    local_78 = 0;
    local_80 = 0;
    local_88 = 0;
    local_90 = 0;
    local_98 = 0;
    local_58 = pSegment;
    local_50 = element_start;
    local_48 = element_size;
    local_40 = pResult;
    do {
      ppVVar6 = local_40;
      if (stop <= pos) {
        lVar9 = -2;
        if (pos == stop) {
          this = (VideoTrack *)operator_new(0x110,(nothrow_t *)&std::nothrow);
          lVar9 = -1;
          if (this != (VideoTrack *)0x0) {
            VideoTrack(this,local_58,local_50,local_48);
            iVar8 = Track::Info::Copy(info,&(this->super_Track).m_info);
            uVar5 = colour_space_ptr;
            uVar4 = colour_ptr;
            uVar3 = projection_ptr;
            if (iVar8 == 0) {
              this->m_width = local_98;
              this->m_height = local_90;
              this->m_display_width = local_88;
              this->m_display_height = local_80;
              this->m_display_unit = local_78;
              this->m_stereo_mode = local_70;
              this->m_rate = local_68;
              colour_ptr._M_t.
              super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>._M_t
              .super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>.
              super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl =
                   (__uniq_ptr_data<mkvparser::Colour,_std::default_delete<mkvparser::Colour>,_true,_true>
                    )(__uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>)
                     0x0;
              this->m_colour =
                   (Colour *)
                   uVar4._M_t.
                   super___uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mkvparser::Colour_*,_std::default_delete<mkvparser::Colour>_>
                   .super__Head_base<0UL,_mkvparser::Colour_*,_false>._M_head_impl;
              colour_space_ptr._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl =
                   (__uniq_ptr_data<char,_std::default_delete<char[]>,_true,_true>)
                   (__uniq_ptr_impl<char,_std::default_delete<char[]>_>)0x0;
              projection_ptr._M_t.
              super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
              ._M_t.
              super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
              .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl =
                   (__uniq_ptr_data<mkvparser::Projection,_std::default_delete<mkvparser::Projection>,_true,_true>
                    )(__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                      )0x0;
              this->m_colour_space =
                   (char *)uVar5._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t
                           .super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                           super__Head_base<0UL,_char_*,_false>._M_head_impl;
              this->m_projection =
                   (Projection *)
                   uVar3._M_t.
                   super___uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_mkvparser::Projection_*,_std::default_delete<mkvparser::Projection>_>
                   .super__Head_base<0UL,_mkvparser::Projection_*,_false>._M_head_impl;
              *ppVVar6 = this;
              lVar9 = 0;
            }
            else {
              (*(this->super_Track)._vptr_Track[1])(this);
            }
          }
        }
        goto LAB_0015d1d9;
      }
      lVar9 = ParseElementHeader(pReader,&pos,stop,&id,&size);
      lVar2 = size;
      lVar1 = pos;
      if (lVar9 < 0) goto LAB_0015d1d9;
      if (id == 0xb0) {
        local_98 = UnserializeUInt(pReader,pos,size);
        lVar10 = local_98;
joined_r0x0015d08f:
        if (lVar10 < 1) break;
      }
      else {
        if (id == 0xba) {
          local_90 = UnserializeUInt(pReader,pos,size);
          lVar10 = local_90;
          goto joined_r0x0015d08f;
        }
        if (id == 0x53b8) {
          local_70 = UnserializeUInt(pReader,pos,size);
          lVar10 = local_70;
joined_r0x0015d0b5:
          if (lVar10 < 0) break;
        }
        else {
          if (id == 0x54b0) {
            local_88 = UnserializeUInt(pReader,pos,size);
            lVar10 = local_88;
            goto joined_r0x0015d08f;
          }
          if (id == 0x54b2) {
            local_78 = UnserializeUInt(pReader,pos,size);
            lVar10 = local_78;
            goto joined_r0x0015d0b5;
          }
          if (id == 0x54ba) {
            local_80 = UnserializeUInt(pReader,pos,size);
            lVar10 = local_80;
            goto joined_r0x0015d08f;
          }
          if (id == 0x55b0) {
            colour_space = (char *)0x0;
            bVar7 = Colour::Parse(pReader,pos,size,(Colour **)&colour_space);
            if (!bVar7) break;
            std::__uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::reset
                      ((__uniq_ptr_impl<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>
                        *)&colour_ptr,(pointer)colour_space);
          }
          else if (id == 0x7670) {
            colour_space = (char *)0x0;
            bVar7 = Projection::Parse(pReader,pos,size,(Projection **)&colour_space);
            if (!bVar7) break;
            std::__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
            ::reset((__uniq_ptr_impl<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>
                     *)&projection_ptr,(pointer)colour_space);
          }
          else if (id == 0x2383e3) {
            lVar9 = UnserializeFloat(pReader,pos,size,&rate);
            if (lVar9 < 0) goto LAB_0015d1d9;
            local_68 = rate;
            if (rate <= 0.0) break;
          }
          else if (id == 0x2eb524) {
            colour_space = (char *)0x0;
            lVar9 = UnserializeString(pReader,pos,size,&colour_space);
            if (lVar9 < 0) goto LAB_0015d1d9;
            std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                      ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)&colour_space_ptr,
                       colour_space);
          }
        }
      }
      pos = lVar1 + lVar2;
    } while (pos <= stop);
    lVar9 = -2;
LAB_0015d1d9:
    std::unique_ptr<mkvparser::Projection,_std::default_delete<mkvparser::Projection>_>::~unique_ptr
              (&projection_ptr);
    std::unique_ptr<mkvparser::Colour,_std::default_delete<mkvparser::Colour>_>::~unique_ptr
              (&colour_ptr);
    std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr(&colour_space_ptr);
  }
  return lVar9;
}

Assistant:

long VideoTrack::Parse(Segment* pSegment, const Info& info,
                       long long element_start, long long element_size,
                       VideoTrack*& pResult) {
  if (pResult)
    return -1;

  if (info.type != Track::kVideo)
    return -1;

  long long width = 0;
  long long height = 0;
  long long display_width = 0;
  long long display_height = 0;
  long long display_unit = 0;
  long long stereo_mode = 0;

  double rate = 0.0;
  std::unique_ptr<char[]> colour_space_ptr;

  IMkvReader* const pReader = pSegment->m_pReader;

  const Settings& s = info.settings;
  assert(s.start >= 0);
  assert(s.size >= 0);

  long long pos = s.start;
  assert(pos >= 0);

  const long long stop = pos + s.size;

  std::unique_ptr<Colour> colour_ptr;
  std::unique_ptr<Projection> projection_ptr;

  while (pos < stop) {
    long long id, size;

    const long status = ParseElementHeader(pReader, pos, stop, id, size);

    if (status < 0)  // error
      return status;

    if (id == libwebm::kMkvPixelWidth) {
      width = UnserializeUInt(pReader, pos, size);

      if (width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvPixelHeight) {
      height = UnserializeUInt(pReader, pos, size);

      if (height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayWidth) {
      display_width = UnserializeUInt(pReader, pos, size);

      if (display_width <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayHeight) {
      display_height = UnserializeUInt(pReader, pos, size);

      if (display_height <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvDisplayUnit) {
      display_unit = UnserializeUInt(pReader, pos, size);

      if (display_unit < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvStereoMode) {
      stereo_mode = UnserializeUInt(pReader, pos, size);

      if (stereo_mode < 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvFrameRate) {
      const long status = UnserializeFloat(pReader, pos, size, rate);

      if (status < 0)
        return status;

      if (rate <= 0)
        return E_FILE_FORMAT_INVALID;
    } else if (id == libwebm::kMkvColour) {
      Colour* colour = NULL;
      if (!Colour::Parse(pReader, pos, size, &colour)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        colour_ptr.reset(colour);
      }
    } else if (id == libwebm::kMkvProjection) {
      Projection* projection = NULL;
      if (!Projection::Parse(pReader, pos, size, &projection)) {
        return E_FILE_FORMAT_INVALID;
      } else {
        projection_ptr.reset(projection);
      }
    } else if (id == libwebm::kMkvColourSpace) {
      char* colour_space = NULL;
      const long status = UnserializeString(pReader, pos, size, colour_space);
      if (status < 0)
        return status;
      colour_space_ptr.reset(colour_space);
    }

    pos += size;  // consume payload
    if (pos > stop)
      return E_FILE_FORMAT_INVALID;
  }

  if (pos != stop)
    return E_FILE_FORMAT_INVALID;

  VideoTrack* const pTrack =
      new (std::nothrow) VideoTrack(pSegment, element_start, element_size);

  if (pTrack == NULL)
    return -1;  // generic error

  const int status = info.Copy(pTrack->m_info);

  if (status) {  // error
    delete pTrack;
    return status;
  }

  pTrack->m_width = width;
  pTrack->m_height = height;
  pTrack->m_display_width = display_width;
  pTrack->m_display_height = display_height;
  pTrack->m_display_unit = display_unit;
  pTrack->m_stereo_mode = stereo_mode;
  pTrack->m_rate = rate;
  pTrack->m_colour = colour_ptr.release();
  pTrack->m_colour_space = colour_space_ptr.release();
  pTrack->m_projection = projection_ptr.release();

  pResult = pTrack;
  return 0;  // success
}